

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pc-identifiers.c
# Opt level: O0

FUNCTION_RETURN generate_ethernet_pc_id(PcIdentifier *identifiers,uint *num_identifiers,int use_mac)

{
  size_t local_40;
  size_t adapters;
  size_t defined_adapters;
  OsAdapterInfo *adapterInfos;
  uint k;
  uint j;
  FUNCTION_RETURN result_adapterInfos;
  int use_mac_local;
  uint *num_identifiers_local;
  PcIdentifier *identifiers_local;
  
  local_40 = 0;
  j = use_mac;
  _result_adapterInfos = num_identifiers;
  num_identifiers_local = (uint *)identifiers;
  if ((identifiers == (PcIdentifier *)0x0) || (*num_identifiers == 0)) {
    k = getAdapterInfos((OsAdapterInfo *)0x0,&local_40);
    if ((k == FUNC_RET_OK) || (k == FUNC_RET_BUFFER_TOO_SMALL)) {
      *_result_adapterInfos = (uint)local_40;
      k = 0;
    }
  }
  else {
    local_40 = (size_t)*num_identifiers;
    adapters = local_40;
    defined_adapters = (size_t)malloc(local_40 * 0x414);
    k = getAdapterInfos((OsAdapterInfo *)defined_adapters,&local_40);
    if ((k == FUNC_RET_BUFFER_TOO_SMALL) || (k == FUNC_RET_OK)) {
      for (adapterInfos._4_4_ = 0; adapterInfos._4_4_ < local_40;
          adapterInfos._4_4_ = adapterInfos._4_4_ + 1) {
        for (adapterInfos._0_4_ = 0; (uint)adapterInfos < 6;
            adapterInfos._0_4_ = (uint)adapterInfos + 1) {
          if (j == 0) {
            if ((uint)adapterInfos < 4) {
              *(undefined1 *)
               ((long)num_identifiers_local +
               (ulong)(uint)adapterInfos + (ulong)adapterInfos._4_4_ * 6) =
                   *(undefined1 *)
                    (defined_adapters + (ulong)adapterInfos._4_4_ * 0x414 + 0x40c +
                    (ulong)(uint)adapterInfos);
            }
            else {
              *(undefined1 *)
               ((long)num_identifiers_local +
               (ulong)(uint)adapterInfos + (ulong)adapterInfos._4_4_ * 6) = 0x2a;
            }
          }
          else {
            *(undefined1 *)
             ((long)num_identifiers_local +
             (ulong)(uint)adapterInfos + (ulong)adapterInfos._4_4_ * 6) =
                 *(undefined1 *)
                  (defined_adapters + (ulong)adapterInfos._4_4_ * 0x414 + 0x404 +
                  (ulong)((uint)adapterInfos + 2));
          }
        }
      }
      k = 0;
      if (adapters < local_40) {
        k = 3;
      }
    }
    free((void *)defined_adapters);
  }
  return k;
}

Assistant:

static FUNCTION_RETURN generate_ethernet_pc_id(PcIdentifier * identifiers,
		unsigned int * num_identifiers, int use_mac) {
	FUNCTION_RETURN result_adapterInfos;
	unsigned int j, k;
	OsAdapterInfo *adapterInfos;
	size_t defined_adapters, adapters = 0;

	if (identifiers == NULL || *num_identifiers == 0) {
		result_adapterInfos = getAdapterInfos(NULL, &adapters);
		if (result_adapterInfos == FUNC_RET_OK
				|| result_adapterInfos == FUNC_RET_BUFFER_TOO_SMALL) {
			*num_identifiers = adapters;
			result_adapterInfos = FUNC_RET_OK;
		}
	} else {
		defined_adapters = adapters = *num_identifiers;
		adapterInfos = (OsAdapterInfo*) malloc(
				adapters * sizeof(OsAdapterInfo));
		result_adapterInfos = getAdapterInfos(adapterInfos, &adapters);
		if (result_adapterInfos == FUNC_RET_BUFFER_TOO_SMALL
				|| result_adapterInfos == FUNC_RET_OK) {
			for (j = 0; j < adapters; j++) {
				for (k = 0; k < 6; k++)
					if (use_mac) {
						identifiers[j][k] = adapterInfos[j].mac_address[k + 2];
					} else {
						//use ip
						if (k < 4) {
							identifiers[j][k] = adapterInfos[j].ipv4_address[k];
						} else {
							//padding
							identifiers[j][k] = 42;
						}
					}
			}
			result_adapterInfos = (
					adapters > defined_adapters ?
							FUNC_RET_BUFFER_TOO_SMALL : FUNC_RET_OK);
		}
		free(adapterInfos);
	}
	return result_adapterInfos;
}